

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O2

IterateResult __thiscall
glcts::PreprocessorCaseGroup::PreprocessorCase::iterate(PreprocessorCase *this)

{
  TestLog *log;
  RenderContext *pRVar1;
  glUniform1iFunc p_Var2;
  glUniform4fFunc p_Var3;
  bool bVar4;
  int iVar5;
  GLenum GVar6;
  GLint GVar7;
  undefined4 extraout_var;
  mapped_type *pmVar8;
  TestError *this_00;
  GLSLVersion glslVersion;
  char *description;
  ShaderProgram *this_01;
  allocator<char> local_292;
  allocator<char> local_291;
  undefined1 local_290 [40];
  Surface resultSurface;
  string frgSrc;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  string local_1f8;
  FBOSentry fbo;
  ShaderProgram p;
  VertexArrayBinding posBinding;
  Functions *gl;
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar5);
  bVar4 = IsExtensionSupported((this->super_TestCase).m_context,"GL_KHR_blend_equation_advanced");
  if (bVar4) {
    FBOSentry::FBOSentry(&fbo,gl,4,4,0x8058);
    (*gl->clearColor)(0.125,0.125,0.125,1.0);
    (*gl->clear)(0x4000);
    args._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &args._M_t._M_impl.super__Rb_tree_header._M_header;
    args._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    args._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    args._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    args._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         args._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    glu::getGLSLVersionDeclaration(this->m_glslVersion);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&p,"VERSION_DIRECTIVE",(allocator<char> *)&posBinding);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&args,(key_type *)&p);
    std::__cxx11::string::assign((char *)pmVar8);
    std::__cxx11::string::~string((string *)&p);
    if (this->m_behaviour == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&p,"EXTENSION_DIRECTIVE",(allocator<char> *)&posBinding);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&args,(key_type *)&p);
      std::__cxx11::string::assign((char *)pmVar8);
      this_01 = &p;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&posBinding,"#extension GL_KHR_blend_equation_advanced : ",
                 (allocator<char> *)&frgSrc);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &posBinding,this->m_behaviour);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_290,"EXTENSION_DIRECTIVE",(allocator<char> *)&resultSurface);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&args,(key_type *)local_290);
      std::__cxx11::string::operator=((string *)pmVar8,(string *)&p);
      std::__cxx11::string::~string((string *)local_290);
      std::__cxx11::string::~string((string *)&p);
      this_01 = (ShaderProgram *)&posBinding;
    }
    std::__cxx11::string::~string((string *)this_01);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&posBinding,
               "${VERSION_DIRECTIVE}\n${EXTENSION_DIRECTIVE}\nprecision highp float;\n\nuniform vec4 uDefined;\nuniform vec4 uNonDefined;\n\nuniform int  uValue;\n\nlayout(location = 0) out vec4 oCol;\n\nvoid main (void) {\n    vec4 col = uNonDefined;\n#if defined(GL_KHR_blend_equation_advanced)\n    int val = GL_KHR_blend_equation_advanced;\n    if (uValue == val) {\n        col = uDefined;\n    }\n#endif\n    oCol = col;\n}\n"
               ,(allocator<char> *)local_290);
    tcu::StringTemplate::StringTemplate((StringTemplate *)&p,(string *)&posBinding);
    tcu::StringTemplate::specialize(&frgSrc,(StringTemplate *)&p,&args);
    tcu::StringTemplate::~StringTemplate((StringTemplate *)&p);
    std::__cxx11::string::~string((string *)&posBinding);
    pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
    GetDef2DVtxSrc_abi_cxx11_
              ((string *)&resultSurface,(glcts *)(ulong)this->m_glslVersion,glslVersion);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_290,(char *)resultSurface._0_8_,&local_291);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,frgSrc._M_dataplus._M_p,&local_292);
    glu::makeVtxFragSources((ProgramSources *)&posBinding,(string *)local_290,&local_1f8);
    glu::ShaderProgram::ShaderProgram(&p,pRVar1,(ProgramSources *)&posBinding);
    glu::ProgramSources::~ProgramSources((ProgramSources *)&posBinding);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)local_290);
    std::__cxx11::string::~string((string *)&resultSurface);
    if (p.m_program.m_info.linkOk == false) {
      glu::operator<<(log,&p);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Compile failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                 ,0x6b6);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*gl->useProgram)(p.m_program.m_program);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"Program failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x6b9);
    p_Var2 = gl->uniform1i;
    GVar7 = (*gl->getUniformLocation)(p.m_program.m_program,"uValue");
    (*p_Var2)(GVar7,1);
    p_Var3 = gl->uniform4f;
    GVar7 = (*gl->getUniformLocation)(p.m_program.m_program,"uDefined");
    (*p_Var3)(GVar7,0.0,1.0,0.0,1.0);
    p_Var3 = gl->uniform4f;
    GVar7 = (*gl->getUniformLocation)(p.m_program.m_program,"uNonDefined");
    (*p_Var3)(GVar7,1.0,0.0,1.0,1.0);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"Uniforms failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x6be);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_290,"aPos",(allocator<char> *)&resultSurface);
    glu::va::Float(&posBinding,(string *)local_290,2,4,0,(float *)s_pos);
    std::__cxx11::string::~string((string *)local_290);
    local_290._0_4_ = R;
    local_290._4_4_ = UNORM_INT32;
    local_290._8_4_ = INDEXTYPE_UINT16;
    local_290._16_8_ = s_indices;
    glu::draw(((this->super_TestCase).m_context)->m_renderCtx,p.m_program.m_program,1,&posBinding,
              (PrimitiveList *)local_290,(DrawUtilCallback *)0x0);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"Draw failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x6c3);
    tcu::Surface::Surface(&resultSurface,4,4);
    pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)local_290,&resultSurface);
    glu::readPixels(pRVar1,0,0,(PixelBufferAccess *)local_290);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"Read pixels failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x6c8);
    description = "Pass";
    if (*resultSurface.m_pixels.m_ptr != -0xff0100) {
      description = "Fail";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (uint)(*resultSurface.m_pixels.m_ptr != -0xff0100),description);
    tcu::Surface::~Surface(&resultSurface);
    std::__cxx11::string::~string((string *)&posBinding.binding.name);
    glu::ShaderProgram::~ShaderProgram(&p);
    std::__cxx11::string::~string((string *)&frgSrc);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&args._M_t);
    FBOSentry::~FBOSentry(&fbo);
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"GL_KHR_blend_equation_advanced");
  }
  return STOP;
}

Assistant:

PreprocessorCaseGroup::PreprocessorCase::IterateResult PreprocessorCaseGroup::PreprocessorCase::iterate(void)
{
	TestLog&			  log = m_testCtx.getLog();
	const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
	const int			  dim = 4;

	if (!IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_KHR_blend_equation_advanced");
		return STOP;
	}

	FBOSentry fbo(gl, dim, dim, GL_RGBA8);
	gl.clearColor(0.125f, 0.125f, 0.125f, 1.f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	// Test that GL_KHR_blend_equation_advanced is defined and it has value 1.
	// Renders green pixels if above is true, red pixels otherwise.
	static const char* frgSrcTemplate = "${VERSION_DIRECTIVE}\n"
										"${EXTENSION_DIRECTIVE}\n"
										"precision highp float;\n"
										"\n"
										"uniform vec4 uDefined;\n"
										"uniform vec4 uNonDefined;\n"
										"\n"
										"uniform int  uValue;\n"
										"\n"
										"layout(location = 0) out vec4 oCol;\n"
										"\n"
										"void main (void) {\n"
										"    vec4 col = uNonDefined;\n"
										"#if defined(GL_KHR_blend_equation_advanced)\n"
										"    int val = GL_KHR_blend_equation_advanced;\n"
										"    if (uValue == val) {\n"
										"        col = uDefined;\n"
										"    }\n"
										"#endif\n"
										"    oCol = col;\n"
										"}\n";

	std::map<std::string, std::string> args;
	args["VERSION_DIRECTIVE"] = glu::getGLSLVersionDeclaration(m_glslVersion);
	if (m_behaviour)
		args["EXTENSION_DIRECTIVE"] = std::string("#extension GL_KHR_blend_equation_advanced : ") + m_behaviour;
	else
		args["EXTENSION_DIRECTIVE"] = "";
	std::string frgSrc				= tcu::StringTemplate(frgSrcTemplate).specialize(args);

	glu::ShaderProgram p(m_context.getRenderContext(),
						 glu::makeVtxFragSources(GetDef2DVtxSrc(m_glslVersion).c_str(), frgSrc.c_str()));
	if (!p.isOk())
	{
		log << p;
		TCU_FAIL("Compile failed");
	}
	gl.useProgram(p.getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Program failed");

	gl.uniform1i(gl.getUniformLocation(p.getProgram(), "uValue"), 1);
	gl.uniform4f(gl.getUniformLocation(p.getProgram(), "uDefined"), 0.f, 1.f, 0.f, 1.f);
	gl.uniform4f(gl.getUniformLocation(p.getProgram(), "uNonDefined"), 1.f, 0.f, 1.f, 1.f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniforms failed");

	glu::VertexArrayBinding posBinding = glu::va::Float("aPos", 2, 4, 0, &s_pos[0]);
	glu::draw(m_context.getRenderContext(), p.getProgram(), 1, &posBinding,
			  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(s_indices), &s_indices[0]));
	GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");

	// Check the results.
	tcu::Surface resultSurface(dim, dim);
	glu::readPixels(m_context.getRenderContext(), 0, 0, resultSurface.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels failed");
	bool pass = tcu::RGBA::green() == resultSurface.getPixel(0, 0);

	m_testCtx.setTestResult(pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, pass ? "Pass" : "Fail");

	return STOP;
}